

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseEditionsTest_InvalidMerge_Test::
~ParseEditionsTest_InvalidMerge_Test(ParseEditionsTest_InvalidMerge_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseEditionsTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseEditionsTest, InvalidMerge) {
  ExpectHasValidationErrors(
      R"schema(
        edition = "2023";
        option features.field_presence = IMPLICIT;
        option java_package = "blah";
        message TestMessage {
          string foo = 1 [
            default = "hello",
            features.field_presence = FIELD_PRESENCE_UNKNOWN,
            features.enum_type = ENUM_TYPE_UNKNOWN
          ];
        })schema",
      "5:17: Feature field `field_presence` must resolve to a known value, "
      "found FIELD_PRESENCE_UNKNOWN\n");
}